

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_table.c
# Opt level: O1

uint64_t llmsset_lookup2(llmsset_t dbs,uint64_t a,uint64_t b,int *created,int custom)

{
  ushort uVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint uVar6;
  int iVar7;
  ulong *puVar8;
  WorkerP *pWVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  bool bVar17;
  bool bVar18;
  uint64_t local_78;
  int local_6c;
  uint64_t local_68;
  uint64_t local_60;
  ulong local_58;
  int *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_58 = 0xcbf29ce484222325;
  local_78 = b;
  local_60 = a;
  local_50 = created;
  if (custom == 0) {
    lVar10 = 0;
    uVar13 = a;
    do {
      local_58 = local_58 ^ *(ulong *)((long)sylvan_tabhash_table + lVar10 + (uVar13 & 0xff) * 8);
      uVar13 = uVar13 >> 8;
      lVar10 = lVar10 + 0x800;
    } while ((int)lVar10 != 0x4000);
    lVar10 = 0;
    uVar13 = b;
    do {
      local_58 = local_58 ^ *(ulong *)(lVar10 + (uVar13 & 0xff) * 8 + 0x13e350);
      uVar13 = uVar13 >> 8;
      lVar10 = lVar10 + 0x800;
    } while ((int)lVar10 != 0x4000);
  }
  else {
    local_58 = (*dbs->hash_cb)(a,b,0xcbf29ce484222325);
  }
  local_38 = local_58 >> 0x11 & 0xfffffffffffffff0 | 8;
  local_40 = local_58 & 0xffffff0000000000;
  uVar12 = dbs->mask & local_58;
  local_6c = 0;
  uVar14 = 0;
  local_48 = uVar12;
  do {
    puVar2 = dbs->table;
    uVar11 = puVar2[uVar12];
    if (uVar11 == 0) {
      if (uVar14 == 0) {
        do {
          if (*(long *)(in_FS_OFFSET + -0x18) == -1) {
            pWVar9 = lace_get_worker();
            uVar1 = pWVar9->worker;
            uVar11 = dbs->table_size;
            uVar6 = lace_workers();
            *(long *)(in_FS_OFFSET + -0x18) =
                 *(long *)(in_FS_OFFSET + -0x18) + ((uVar11 >> 9) * (ulong)uVar1) / (ulong)uVar6;
          }
          else {
            puVar8 = dbs->bitmap2 + *(long *)(in_FS_OFFSET + -0x18) * 8;
            for (iVar7 = 0; iVar7 < 8; iVar7 = iVar7 + 1) {
              if (*puVar8 != 0xffffffffffffffff) {
                uVar14 = LZCOUNT(~*puVar8);
                LOCK();
                *puVar8 = *puVar8 | 0x8000000000000000U >> (uVar14 & 0x3f);
                UNLOCK();
                uVar14 = (long)iVar7 * 0x40 + *(long *)(in_FS_OFFSET + -0x18) * 0x200 | uVar14;
                break;
              }
              puVar8 = puVar8 + 1;
            }
            if (iVar7 < 8) break;
          }
          bVar18 = dbs->table_size < 0x200;
          if (!bVar18) {
            uVar11 = dbs->table_size >> 9;
            bVar18 = false;
            do {
              uVar11 = uVar11 - 1;
              uVar16 = *(long *)(in_FS_OFFSET + -0x18) + 1;
              *(ulong *)(in_FS_OFFSET + -0x18) = uVar16;
              if (dbs->table_size >> 9 <= uVar16) {
                uVar16 = 0;
              }
              *(ulong *)(in_FS_OFFSET + -0x18) = uVar16;
              puVar3 = dbs->bitmap1;
              uVar15 = 0x8000000000000000 >> (uVar16 & 0x3f);
              while (uVar4 = puVar3[uVar16 >> 6], (uVar4 & uVar15) == 0) {
                puVar8 = puVar3 + (uVar16 >> 6);
                LOCK();
                bVar17 = uVar4 == *puVar8;
                if (bVar17) {
                  *puVar8 = uVar4 | uVar15;
                }
                UNLOCK();
                if (bVar17) goto LAB_0011e5b8;
              }
              bVar18 = uVar11 == 0;
            } while (!bVar18);
          }
          uVar14 = 0xffffffffffffffff;
LAB_0011e5b8:
        } while (!bVar18);
        if (uVar14 != 0xffffffffffffffff) {
          if (custom != 0) {
            (*dbs->create_cb)(&local_60,&local_78);
          }
          puVar5 = dbs->data;
          *(uint64_t *)(puVar5 + uVar14 * 0x10) = local_60;
          *(uint64_t *)(puVar5 + uVar14 * 0x10 + 8) = local_78;
          goto LAB_0011e666;
        }
        uVar14 = 0xffffffffffffffff;
LAB_0011e7af:
        bVar18 = false;
        local_68 = 0;
      }
      else {
LAB_0011e666:
        puVar8 = puVar2 + uVar12;
        LOCK();
        uVar11 = *puVar8;
        bVar18 = uVar11 == 0;
        if (bVar18) {
          *puVar8 = uVar14 | local_40;
          uVar11 = 0;
        }
        UNLOCK();
        if (!bVar18) goto LAB_0011e6aa;
        if (custom != 0) {
          dbs->bitmapc[uVar14 >> 6] =
               dbs->bitmapc[uVar14 >> 6] | 0x8000000000000000U >> (uVar14 & 0x3f);
        }
        *local_50 = 1;
        bVar18 = false;
        local_68 = uVar14;
      }
    }
    else {
LAB_0011e6aa:
      if (local_40 == (uVar11 & 0xffffff0000000000)) {
        lVar10 = (uVar11 & 0xffffffffff) * 0x10;
        puVar5 = dbs->data;
        if (custom == 0) {
          bVar18 = true;
          if ((*(uint64_t *)(puVar5 + lVar10) == local_60) &&
             (*(uint64_t *)(puVar5 + lVar10 + 8) == local_78)) {
            if (uVar14 != 0) goto LAB_0011e70c;
            goto LAB_0011e724;
          }
        }
        else {
          iVar7 = (*dbs->equals_cb)(local_60,local_78,*(uint64_t *)(puVar5 + lVar10),
                                    *(uint64_t *)(puVar5 + lVar10 + 8));
          if (iVar7 == 0) {
            bVar18 = true;
          }
          else {
            if (uVar14 != 0) {
              (*dbs->destroy_cb)(local_60,local_78);
LAB_0011e70c:
              LOCK();
              dbs->bitmap2[uVar14 >> 6] =
                   dbs->bitmap2[uVar14 >> 6] & ~(0x8000000000000000U >> (uVar14 & 0x3f));
              UNLOCK();
            }
LAB_0011e724:
            *local_50 = 0;
            bVar18 = false;
            local_68 = uVar11 & 0xffffffffff;
          }
        }
        if (!bVar18) {
          bVar18 = false;
          goto LAB_0011e7ba;
        }
      }
      uVar12 = (ulong)((int)uVar12 + 1U & 7) | uVar12 & 0xfffffffffffffff8;
      bVar18 = true;
      if (uVar12 == local_48) {
        local_6c = local_6c + 1;
        if (local_6c == dbs->threshold) goto LAB_0011e7af;
        local_58 = local_58 + local_38;
        uVar12 = dbs->mask & local_58;
        local_48 = uVar12;
      }
    }
LAB_0011e7ba:
    if (!bVar18) {
      return local_68;
    }
  } while( true );
}

Assistant:

static inline uint64_t
llmsset_lookup2(const llmsset_t dbs, uint64_t a, uint64_t b, int* created, const int custom)
{
    uint64_t hash_rehash = 14695981039346656037LLU;
    if (custom) hash_rehash = dbs->hash_cb(a, b, hash_rehash);
    else hash_rehash = sylvan_tabhash16(a, b, hash_rehash);

    const uint64_t step = (((hash_rehash >> 20) | 1) << 3);
    const uint64_t hash = hash_rehash & MASK_HASH;
    uint64_t idx, last, cidx = 0;
    int i=0;

#if LLMSSET_MASK
    last = idx = hash_rehash & dbs->mask;
#else
    last = idx = hash_rehash % dbs->table_size;
#endif

    for (;;) {
        _Atomic(uint64_t)* bucket = dbs->table + idx;
        uint64_t v = atomic_load_explicit(bucket, memory_order_acquire);

        if (v == 0) {
            if (cidx == 0) {
                // Claim data bucket and write data
                cidx = claim_data_bucket(dbs);
                if (cidx == (uint64_t)-1) return 0; // failed to claim a data bucket
                if (custom) dbs->create_cb(&a, &b);
                uint64_t *d_ptr = ((uint64_t*)dbs->data) + 2*cidx;
                d_ptr[0] = a;
                d_ptr[1] = b;
            }
            if (atomic_compare_exchange_strong(bucket, &v, hash | cidx)) {
                if (custom) set_custom_bucket(dbs, cidx, custom);
                *created = 1;
                return cidx;
            }
        }

        if (hash == (v & MASK_HASH)) {
            uint64_t d_idx = v & MASK_INDEX;
            uint64_t *d_ptr = ((uint64_t*)dbs->data) + 2*d_idx;
            if (custom) {
                if (dbs->equals_cb(a, b, d_ptr[0], d_ptr[1])) {
                    if (cidx != 0) {
                        dbs->destroy_cb(a, b);
                        release_data_bucket(dbs, cidx);
                    }
                    *created = 0;
                    return d_idx;
                }
            } else {
                if (d_ptr[0] == a && d_ptr[1] == b) {
                    if (cidx != 0) release_data_bucket(dbs, cidx);
                    *created = 0;
                    return d_idx;
                }
            }
        }

        sylvan_stats_count(LLMSSET_LOOKUP);

        // find next idx on probe sequence
        idx = (idx & CL_MASK) | ((idx+1) & CL_MASK_R);
        if (idx == last) {
            if (++i == dbs->threshold) return 0; // failed to find empty spot in probe sequence

            // go to next cache line in probe sequence
            hash_rehash += step;

#if LLMSSET_MASK
            last = idx = hash_rehash & dbs->mask;
#else
            last = idx = hash_rehash % dbs->table_size;
#endif
        }
    }
}